

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder_mf.c
# Opt level: O2

void lzma_mf_hc4_skip(lzma_mf *mf,uint32_t amount)

{
  uint32_t uVar1;
  uint8_t *puVar2;
  uint32_t *puVar3;
  uint32_t uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  do {
    uVar5 = mf->read_pos;
    if (mf->write_pos - uVar5 < 4) {
      move_pending(mf);
    }
    else {
      uVar4 = mf->offset + uVar5;
      puVar2 = mf->buffer;
      uVar6 = (uint)puVar2[(ulong)uVar5 + 1] ^ lzma_crc32_table[0][puVar2[uVar5]];
      puVar3 = mf->hash;
      uVar7 = (uint)puVar2[(ulong)uVar5 + 2] << 8 ^ uVar6;
      uVar5 = ((lzma_crc32_table[0][puVar2[(ulong)uVar5 + 3]] << 5 ^ uVar7) & mf->hash_mask) +
              0x10400;
      uVar1 = puVar3[uVar5];
      puVar3[uVar6 & 0x3ff] = uVar4;
      puVar3[(ulong)(uVar7 & 0xffff) + 0x400] = uVar4;
      puVar3[uVar5] = uVar4;
      mf->son[mf->cyclic_pos] = uVar1;
      move_pos(mf);
    }
    amount = amount - 1;
  } while (amount != 0);
  return;
}

Assistant:

extern void
lzma_mf_hc4_skip(lzma_mf *mf, uint32_t amount)
{
	do {
		const uint8_t *cur;
		uint32_t pos;
		uint32_t temp, hash_value, hash_2_value, hash_3_value; /* hash_4_calc */
		uint32_t cur_match;

		if (mf_avail(mf) < 4) {
			move_pending(mf);
			continue;
		}

		cur = mf_ptr(mf);
		pos = mf->read_pos + mf->offset;

		hash_4_calc();

		cur_match = mf->hash[FIX_4_HASH_SIZE + hash_value];

		mf->hash[hash_2_value] = pos;
		mf->hash[FIX_3_HASH_SIZE + hash_3_value] = pos;
		mf->hash[FIX_4_HASH_SIZE + hash_value] = pos;

		hc_skip();

	} while (--amount != 0);
}